

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

int tlp_calculate_lstdw(uintptr_t addr,size_t count)

{
  ulong uVar1;
  uintptr_t start;
  uintptr_t end_start;
  uintptr_t end;
  size_t count_local;
  uintptr_t addr_local;
  undefined4 local_4;
  
  uVar1 = addr + count;
  if ((uVar1 & 3) == 0) {
    end_start = uVar1 - 4;
  }
  else {
    end_start = uVar1 & 0xfffffffffffffffc;
  }
  if (end_start <= (addr & 0xfffffffffffffffc)) {
    end_start = addr + 4;
  }
  if (uVar1 < end_start) {
    local_4 = 0;
  }
  else {
    local_4 = (0xf << ((char)uVar1 - (char)end_start & 0x1fU) ^ 0xffffffffU) & 0xf;
  }
  return local_4;
}

Assistant:

int tlp_calculate_lstdw(uintptr_t addr, size_t count)
{
	uintptr_t end, end_start, start;

	start = (addr >> 2) << 2;
	end = addr + count;
	if ((end & 0x3) == 0)
		end_start = end - 4;
	else
		end_start = (end >> 2) << 2;

	/* corner case. count is smaller than 8 */
	if (end_start <= start)
		end_start = addr + 4;
	if (end < end_start)
		return 0;

	return ~(0xF << (end - end_start)) & 0xF;
}